

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O0

TestNode * __thiscall xe::TestGroup::findChildNode(TestGroup *this,char *path)

{
  bool bVar1;
  int compLen_00;
  deBool dVar2;
  TestNodeType TVar3;
  Error *this_00;
  reference ppTVar4;
  char *name;
  __normal_iterator<xe::TestNode_*const_*,_std::vector<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>_>
  local_50;
  __normal_iterator<xe::TestNode_*const_*,_std::vector<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>_>
  local_48;
  const_iterator iter;
  TestNode *matchingNode;
  int compLen;
  char *path_local;
  TestGroup *this_local;
  
  compLen_00 = getFirstComponentLength(path);
  do {
    dVar2 = deGetFalse();
    if (dVar2 != 0 || compLen_00 < 1) {
      this_00 = (Error *)__cxa_allocate_exception(0x10);
      Error::Error(this_00,(char *)0x0,"compLen > 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTestCase.cpp"
                   ,0xce);
      __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
    }
    dVar2 = deGetFalse();
  } while (dVar2 != 0);
  iter._M_current = (TestNode **)0x0;
  local_48._M_current =
       (TestNode **)
       std::vector<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>::begin(&this->m_children);
  do {
    local_50._M_current =
         (TestNode **)
         std::vector<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>::end(&this->m_children);
    bVar1 = __gnu_cxx::operator!=(&local_48,&local_50);
    if (!bVar1) {
LAB_0015f720:
      if (iter._M_current == (TestNode **)0x0) {
        this_local = (TestGroup *)0x0;
      }
      else if (path[compLen_00] == '\0') {
        this_local = (TestGroup *)iter._M_current;
      }
      else {
        TVar3 = TestNode::getNodeType((TestNode *)iter._M_current);
        if (TVar3 == TESTNODETYPE_GROUP) {
          this_local = (TestGroup *)
                       findChildNode((TestGroup *)iter._M_current,path + (long)compLen_00 + 1);
        }
        else {
          this_local = (TestGroup *)0x0;
        }
      }
      return &this_local->super_TestNode;
    }
    ppTVar4 = __gnu_cxx::
              __normal_iterator<xe::TestNode_*const_*,_std::vector<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>_>
              ::operator*(&local_48);
    name = TestNode::getName(*ppTVar4);
    bVar1 = compareNameToPathComponent(name,path,compLen_00);
    if (bVar1) {
      ppTVar4 = __gnu_cxx::
                __normal_iterator<xe::TestNode_*const_*,_std::vector<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>_>
                ::operator*(&local_48);
      iter._M_current = (TestNode **)*ppTVar4;
      goto LAB_0015f720;
    }
    __gnu_cxx::
    __normal_iterator<xe::TestNode_*const_*,_std::vector<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>_>
    ::operator++(&local_48,0);
  } while( true );
}

Assistant:

const TestNode* TestGroup::findChildNode (const char* path) const
{
	int compLen = getFirstComponentLength(path);
	XE_CHECK(compLen > 0);

	// Try to find matching children.
	const TestNode* matchingNode = DE_NULL;
	for (vector<TestNode*>::const_iterator iter = m_children.begin(); iter != m_children.end(); iter++)
	{
		if (compareNameToPathComponent((*iter)->getName(), path, compLen))
		{
			matchingNode = *iter;
			break;
		}
	}

	if (matchingNode)
	{
		if (path[compLen] == 0)
			return matchingNode; // Last element in path, return matching node.
		else if (matchingNode->getNodeType() == TESTNODETYPE_GROUP)
			return static_cast<const TestGroup*>(matchingNode)->findChildNode(path + compLen + 1);
		else
			return DE_NULL;
	}
	else
		return DE_NULL;
}